

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

void lws_hex_from_byte_array(uint8_t *src,size_t slen,char *dest,size_t len)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  
  pcVar2 = dest + (len - 1);
  sVar5 = 0;
  for (lVar3 = len - 1; (pcVar4 = dest, slen != sVar5 && (lVar3 != 0)); lVar3 = lVar3 + -2) {
    bVar1 = src[sVar5];
    *dest = "0123456789abcdef"[bVar1 >> 4];
    pcVar4 = pcVar2;
    if (lVar3 == 1) break;
    dest[1] = "0123456789abcdef"[bVar1 & 0xf];
    dest = dest + 2;
    sVar5 = sVar5 + 1;
  }
  *pcVar4 = '\0';
  return;
}

Assistant:

void
lws_hex_from_byte_array(const uint8_t *src, size_t slen, char *dest, size_t len)
{
	char *end = &dest[len - 1];

	while (slen-- && dest != end) {
		uint8_t b = *src++;
		*dest++ = hexch[b >> 4];
		if (dest == end)
			break;
		*dest++ = hexch[b & 0xf];
	}

	*dest = '\0';
}